

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O0

void __thiscall
ImplDispatchTest_AES_single_block_Test::TestBody(ImplDispatchTest_AES_single_block_Test *this)

{
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  byte local_191;
  anon_class_8_1_ba1d59bf local_190;
  function<void_()> local_188;
  allocator<std::pair<unsigned_long,_bool>_> local_152;
  bool local_151;
  pair<unsigned_long,_bool> local_150;
  pair<unsigned_long,_bool> pStack_140;
  iterator local_130;
  size_type local_128;
  vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> local_120
  ;
  undefined1 local_104 [8];
  AES_KEY key;
  ImplDispatchTest_AES_single_block_Test *this_local;
  
  key._236_8_ = this;
  AES_set_encrypt_key("",0x80,(AES_KEY *)local_104);
  std::pair<unsigned_long,_bool>::pair<bool_&,_true>
            (&local_150,&kFlag_aes_hw_encrypt,&(this->super_ImplDispatchTest).aesni_);
  local_191 = 0;
  if (((this->super_ImplDispatchTest).ssse3_ & 1U) != 0) {
    local_191 = (this->super_ImplDispatchTest).aesni_ ^ 0xff;
  }
  local_151 = (bool)(local_191 & 1);
  std::pair<unsigned_long,_bool>::pair<bool,_true>(&pStack_140,&kFlag_vpaes_encrypt,&local_151);
  local_130 = &local_150;
  local_128 = 2;
  std::allocator<std::pair<unsigned_long,_bool>_>::allocator(&local_152);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector(&local_120,__l,&local_152);
  local_190.key = (AES_KEY *)local_104;
  std::function<void()>::function<ImplDispatchTest_AES_single_block_Test::TestBody()::__0,void>
            ((function<void()> *)&local_188,&local_190);
  ImplDispatchTest::AssertFunctionsHit(&this->super_ImplDispatchTest,&local_120,&local_188);
  std::function<void_()>::~function(&local_188);
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  ~vector(&local_120);
  std::allocator<std::pair<unsigned_long,_bool>_>::~allocator(&local_152);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AES_single_block) {
  AES_KEY key;
  static const uint8_t kZeros[16] = {0};
  AES_set_encrypt_key(kZeros, sizeof(kZeros) * 8, &key);

  AssertFunctionsHit(
      {
          {kFlag_aes_hw_encrypt, aesni_},
          {kFlag_vpaes_encrypt, ssse3_ && !aesni_},
      },
      [&key] {
        uint8_t in[AES_BLOCK_SIZE] = {0};
        uint8_t out[AES_BLOCK_SIZE];
        AES_encrypt(in, out, &key);
      });
}